

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::DOMLSParserImpl::error
          (DOMLSParserImpl *this,uint code,XMLCh *param_2,ErrTypes errType,XMLCh *errorText,
          XMLCh *systemId,XMLCh *param_6,XMLFileLoc lineNum,XMLFileLoc colNum)

{
  XMLScanner *pXVar1;
  char cVar2;
  uint *puVar3;
  ErrorSeverity severity;
  DOMLocatorImpl location;
  DOMErrorImpl domError;
  
  if (this->fErrorHandler != (DOMErrorHandler *)0x0) {
    severity = DOM_SEVERITY_WARNING;
    if (errType != ErrType_Warning) {
      severity = errType == ErrType_Fatal | DOM_SEVERITY_ERROR;
    }
    DOMLocatorImpl::DOMLocatorImpl
              (&location,lineNum,colNum,(this->super_AbstractDOMParser).fCurrentNode,systemId,
               0xffffffffffffffff,0xffffffffffffffff);
    pXVar1 = (this->super_AbstractDOMParser).fScanner;
    if (pXVar1->fCalculateSrcOfs == true) {
      location.fByteOffset = ReaderMgr::getSrcOffset(&pXVar1->fReaderMgr);
    }
    DOMErrorImpl::DOMErrorImpl(&domError,severity,errorText,&location.super_DOMLocator);
    cVar2 = (**(code **)(*(long *)this->fErrorHandler + 0x10))(this->fErrorHandler,&domError);
    if ((cVar2 == '\0') && (((this->super_AbstractDOMParser).fScanner)->fInException == false)) {
      puVar3 = (uint *)__cxa_allocate_exception(4);
      *puVar3 = code;
      __cxa_throw(puVar3,&XMLErrs::Codes::typeinfo,0);
    }
    DOMErrorImpl::~DOMErrorImpl(&domError);
    DOMLocatorImpl::~DOMLocatorImpl(&location);
  }
  return;
}

Assistant:

void DOMLSParserImpl::error( const   unsigned int                code
                            , const XMLCh* const
                            , const XMLErrorReporter::ErrTypes  errType
                            , const XMLCh* const                errorText
                            , const XMLCh* const                systemId
                            , const XMLCh* const
                            , const XMLFileLoc                  lineNum
                            , const XMLFileLoc                  colNum)
{
    if (fErrorHandler) {

        DOMError::ErrorSeverity severity = DOMError::DOM_SEVERITY_ERROR;

        if (errType == XMLErrorReporter::ErrType_Warning)
            severity = DOMError::DOM_SEVERITY_WARNING;
        else if (errType == XMLErrorReporter::ErrType_Fatal)
            severity = DOMError::DOM_SEVERITY_FATAL_ERROR;

        DOMLocatorImpl location(lineNum, colNum, getCurrentNode(), systemId);
        if(getScanner()->getCalculateSrcOfs())
            location.setByteOffset(getScanner()->getSrcOffset());
        DOMErrorImpl domError(severity, errorText, &location);

        // if user return false, we should stop the process, so throw an error
        bool toContinueProcess = true;
        try
        {
            toContinueProcess = fErrorHandler->handleError(domError);
        }
        catch(...)
        {
        }
        if (!toContinueProcess && !getScanner()->getInException())
            throw (XMLErrs::Codes) code;
    }
}